

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

int main(void)

{
  undefined *puVar1;
  uchar *buffer;
  cs_err cVar2;
  size_t count;
  size_t sVar3;
  long lVar4;
  int i;
  long lVar5;
  bool bVar6;
  csh handle;
  cs_insn *insn;
  
  for (lVar5 = 0; lVar5 != 0x15; lVar5 = lVar5 + 1) {
    puts("****************");
    puVar1 = (&PTR_anon_var_dwarf_45_00267278)[lVar5 * 5];
    printf("Platform: %s\n",puVar1);
    cVar2 = cs_open((&DAT_00267260)[lVar5 * 10],(&DAT_00267264)[lVar5 * 10],&handle);
    if (cVar2 == CS_ERR_OK) {
      if ((&DAT_00267280)[lVar5 * 10] != CS_OPT_INVALID) {
        cs_option(handle,(&DAT_00267280)[lVar5 * 10],(ulong)(uint)(&DAT_00267284)[lVar5 * 10]);
      }
      buffer = (&PTR_anon_var_dwarf_27_00267268)[lVar5 * 5];
      sVar3 = (&DAT_00267270)[lVar5 * 5];
      count = cs_disasm(handle,buffer,sVar3,0x1000,0,&insn);
      if (count == 0) {
        puts("****************");
        printf("Platform: %s\n",puVar1);
        print_string_hex(buffer,sVar3);
        puts("ERROR: Failed to disasm given code!");
      }
      else {
        print_string_hex(buffer,sVar3);
        puts("Disasm:");
        lVar4 = 0x22;
        sVar3 = count;
        while( true ) {
          bVar6 = sVar3 == 0;
          sVar3 = sVar3 - 1;
          if (bVar6) break;
          printf("0x%lx:\t%s\t\t%s\n",*(undefined8 *)(insn->bytes + lVar4 + -0x2c),
                 insn->bytes + lVar4 + -0x12);
          lVar4 = lVar4 + 0xf0;
        }
        printf("0x%lx:\n",(ulong)insn[count - 1].size + insn[count - 1].address);
        cs_free(insn,count);
      }
      putchar(10);
      cs_close(&handle);
    }
    else {
      printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar2);
    }
  }
  return 0;
}

Assistant:

int main()
{
	test();

#if 0
#define offsetof(st, m) __builtin_offsetof(st, m)

	cs_insn insn;
	printf("size: %lu\n", sizeof(insn));
	printf("@id: %lu\n", offsetof(cs_insn, id));
	printf("@address: %lu\n", offsetof(cs_insn, address));
	printf("@size: %lu\n", offsetof(cs_insn, size));
	printf("@bytes: %lu\n", offsetof(cs_insn, bytes));
	printf("@mnemonic: %lu\n", offsetof(cs_insn, mnemonic));
	printf("@op_str: %lu\n", offsetof(cs_insn, op_str));
	printf("@regs_read: %lu\n", offsetof(cs_insn, regs_read));
	printf("@regs_read_count: %lu\n", offsetof(cs_insn, regs_read_count));
	printf("@regs_write: %lu\n", offsetof(cs_insn, regs_write));
	printf("@regs_write_count: %lu\n", offsetof(cs_insn, regs_write_count));
	printf("@groups: %lu\n", offsetof(cs_insn, groups));
	printf("@groups_count: %lu\n", offsetof(cs_insn, groups_count));
	printf("@arch: %lu\n", offsetof(cs_insn, x86));
#endif

	return 0;
}